

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O2

void __thiscall BCL::write<char>(BCL *this,char *src,GlobalPtr<char> dst,size_t size)

{
  int iVar1;
  char *__dest;
  debug_error *pdVar2;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  GlobalPtr<char> dst_local;
  MPI_Request request;
  
  __n = dst.ptr;
  dst_local.ptr = dst.rank;
  dst_local.rank = (size_t)src;
  if (my_nprocs < src) {
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string((string *)&request,(unsigned_long)src);
    std::operator+(&local_90,"BCL write(): request to write to rank ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&request);
    std::operator+(&local_70,&local_90,", which does not exist");
    debug_error::debug_error(pdVar2,&local_70);
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  if (my_rank == src) {
    __dest = GlobalPtr<char>::local(&dst_local);
    memcpy(__dest,this,__n);
  }
  else {
    iVar1 = MPI_Rput(this,__n & 0xffffffff,&ompi_mpi_char,(ulong)src & 0xffffffff,dst_local.ptr,
                     __n & 0xffffffff,&ompi_mpi_char,win,&request);
    if (iVar1 != 0) {
      pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_90,iVar1);
      std::operator+(&local_70,"BCL write(): MPI_Rput return error code.",&local_90);
      debug_error::debug_error(pdVar2,&local_70);
      __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
    }
    iVar1 = MPI_Wait(&request,0);
    if (iVar1 != 0) {
      pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_90,iVar1);
      std::operator+(&local_70,"BCL write(): MPI_Wait return error code ",&local_90);
      debug_error::debug_error(pdVar2,&local_70);
      __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
    }
  }
  return;
}

Assistant:

inline void write(const T *src, GlobalPtr<T> dst, size_t size) {
  BCL_DEBUG(
    if (dst.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL write(): request to write to rank " +
                        std::to_string(dst.rank) + ", which does not exist");
    }
  )
  if (dst.rank == BCL::rank()) {
    std::memcpy(dst.local(), src, size*sizeof(T));
  } else {
    MPI_Request request;

    int error_code = MPI_Rput(src, size*sizeof(T), MPI_CHAR,
                              dst.rank, dst.ptr, size*sizeof(T), MPI_CHAR,
                              BCL::win, &request);
    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Rput return error code." + std::to_string(error_code));
            }
    )

    error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);

    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Wait return error code " + std::to_string(error_code));
            }
    )
  }
}